

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O2

FT_Error FT_Stream_EnterFrame(FT_Stream stream,FT_ULong count)

{
  ulong uVar1;
  FT_Memory memory;
  ulong uVar2;
  uint in_EAX;
  FT_Error FVar3;
  uchar *puVar4;
  unsigned_long uVar5;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  uVar1 = stream->size;
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    uVar2 = stream->pos;
    if (count <= uVar1 - uVar2 && uVar2 < uVar1) {
      stream->cursor = stream->base + uVar2;
      stream->limit = stream->base + uVar2 + count;
      stream->pos = uVar2 + count;
      return 0;
    }
  }
  else if (count <= uVar1) {
    memory = stream->memory;
    puVar4 = (uchar *)ft_mem_qalloc(memory,count,(FT_Error *)((long)&uStack_28 + 4));
    stream->base = puVar4;
    if (uStack_28._4_4_ != 0) {
      return uStack_28._4_4_;
    }
    uVar5 = (*stream->read)(stream,stream->pos,puVar4,count);
    FVar3 = 0;
    puVar4 = stream->base;
    if (uVar5 < count) {
      if (puVar4 != (uchar *)0x0) {
        (*memory->free)(memory,puVar4);
      }
      stream->base = (uchar *)0x0;
      FVar3 = 0x55;
      puVar4 = (uchar *)0x0;
    }
    stream->cursor = puVar4;
    stream->limit = puVar4 + count;
    stream->pos = stream->pos + uVar5;
    return FVar3;
  }
  return 0x55;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Stream_EnterFrame( FT_Stream  stream,
                        FT_ULong   count )
  {
    FT_Error  error = FT_Err_Ok;
    FT_ULong  read_bytes;


    /* check for nested frame access */
    FT_ASSERT( stream && stream->cursor == 0 );

    if ( stream->read )
    {
      /* allocate the frame in memory */
      FT_Memory  memory = stream->memory;


      /* simple sanity check */
      if ( count > stream->size )
      {
        FT_ERROR(( "FT_Stream_EnterFrame:"
                   " frame size (%lu) larger than stream size (%lu)\n",
                   count, stream->size ));

        error = FT_THROW( Invalid_Stream_Operation );
        goto Exit;
      }

#ifdef FT_DEBUG_MEMORY
      /* assume _ft_debug_file and _ft_debug_lineno are already set */
      stream->base = (unsigned char*)ft_mem_qalloc( memory,
                                                    (FT_Long)count,
                                                    &error );
      if ( error )
        goto Exit;
#else
      if ( FT_QALLOC( stream->base, count ) )
        goto Exit;
#endif
      /* read it */
      read_bytes = stream->read( stream, stream->pos,
                                 stream->base, count );
      if ( read_bytes < count )
      {
        FT_ERROR(( "FT_Stream_EnterFrame:"
                   " invalid read; expected %lu bytes, got %lu\n",
                   count, read_bytes ));

        FT_FREE( stream->base );
        error = FT_THROW( Invalid_Stream_Operation );
      }
      stream->cursor = stream->base;
      stream->limit  = stream->cursor + count;
      stream->pos   += read_bytes;
    }
    else
    {
      /* check current and new position */
      if ( stream->pos >= stream->size        ||
           stream->size - stream->pos < count )
      {
        FT_ERROR(( "FT_Stream_EnterFrame:"
                   " invalid i/o; pos = 0x%lx, count = %lu, size = 0x%lx\n",
                   stream->pos, count, stream->size ));

        error = FT_THROW( Invalid_Stream_Operation );
        goto Exit;
      }

      /* set cursor */
      stream->cursor = stream->base + stream->pos;
      stream->limit  = stream->cursor + count;
      stream->pos   += count;
    }

  Exit:
    return error;
  }